

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeSorterIterRead(sqlite3 *db,VdbeSorterIter *p,int nByte,u8 **ppOut)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  u8 *__dest;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  u8 *aNext;
  u8 *local_38;
  
  lVar1 = p->iReadOff;
  iVar6 = p->nBuffer;
  lVar5 = lVar1 % (long)iVar6;
  if (lVar5 == 0) {
    lVar4 = p->iEof - lVar1;
    if (lVar4 <= iVar6) {
      iVar6 = (int)lVar4;
    }
    iVar6 = (*p->pFile->pMethods->xRead)(p->pFile,p->aBuffer,iVar6,lVar1);
    if (iVar6 != 0) {
      return iVar6;
    }
    iVar6 = p->nBuffer;
  }
  iVar6 = iVar6 - (int)lVar5;
  if (iVar6 < nByte) {
    iVar7 = p->nAlloc;
    if (iVar7 < nByte) {
      do {
        iVar7 = iVar7 * 2;
      } while (iVar7 < nByte);
      __dest = (u8 *)sqlite3DbReallocOrFree(db,p->aAlloc,iVar7);
      p->aAlloc = __dest;
      if (__dest == (u8 *)0x0) {
        return 7;
      }
      p->nAlloc = iVar7;
    }
    else {
      __dest = p->aAlloc;
    }
    memcpy(__dest,p->aBuffer + lVar5,(long)iVar6);
    p->iReadOff = p->iReadOff + (long)iVar6;
    if (nByte - iVar6 != 0 && iVar6 <= nByte) {
      iVar6 = nByte - iVar6;
      do {
        iVar7 = p->nBuffer;
        if (iVar6 < p->nBuffer) {
          iVar7 = iVar6;
        }
        iVar3 = vdbeSorterIterRead(db,p,iVar7,&local_38);
        if (iVar3 != 0) {
          return iVar3;
        }
        memcpy(p->aAlloc + (nByte - iVar6),local_38,(long)iVar7);
        iVar3 = iVar6 - iVar7;
        bVar2 = iVar7 <= iVar6;
        iVar6 = iVar3;
      } while (iVar3 != 0 && bVar2);
    }
    *ppOut = p->aAlloc;
  }
  else {
    *ppOut = p->aBuffer + lVar5;
    p->iReadOff = p->iReadOff + (long)nByte;
  }
  return 0;
}

Assistant:

static int vdbeSorterIterRead(
  sqlite3 *db,                    /* Database handle (for malloc) */
  VdbeSorterIter *p,              /* Iterator */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */
  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next 
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Read data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFile, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf; 

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a 
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      int nNew = p->nAlloc*2;
      while( nByte>nNew ) nNew = nNew*2;
      p->aAlloc = sqlite3DbReallocOrFree(db, p->aAlloc, nNew);
      if( !p->aAlloc ) return SQLITE_NOMEM;
      p->nAlloc = nNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbeSorterIterRead() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbeSorterIterRead(db, p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}